

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  ulong *puVar2;
  TestError *this_00;
  long lVar3;
  string shader_source;
  string base_variable_string;
  string example_struct2;
  string example_struct1;
  string temp;
  string variable_basenames [8];
  string full_variable_names [8];
  long *local_548 [2];
  long local_538 [2];
  SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::ES> *local_528;
  TestShaderType local_51c;
  undefined1 *local_518;
  long local_510;
  undefined1 local_508 [32];
  ulong local_4e8;
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [48];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [3];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248;
  ulong uStack_240;
  undefined1 *local_238;
  long lStack_230;
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  ulong *local_158 [2];
  ulong local_148 [2];
  string local_138 [8];
  undefined8 local_130;
  string local_128 [248];
  
  local_4c0[0] = local_4b0;
  local_528 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"\nvoid my_function(","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,")\n{\n}\n\n","");
  local_518 = local_508;
  local_510 = 0;
  local_508[0] = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"v1","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"v2","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"v3","");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"v4","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"v5","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"v6","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"v7","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"v8","");
  lVar1 = 0x10;
  do {
    *(string **)((long)local_148 + lVar1) = local_138 + lVar1;
    *(undefined8 *)((long)local_148 + lVar1 + 8) = 0;
    local_138[lVar1] = (string)0x0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x110);
  lVar1 = 1;
  lVar3 = 0;
  local_51c = tested_shader_type;
  do {
    local_460[0] = local_450;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_460,*(long *)((long)&local_238 + lVar3),
               *(long *)(local_228 + lVar3 + -8) + *(long *)((long)&local_238 + lVar3));
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"[2]","");
    (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[6])
              (local_548,local_528,(string *)local_460,(string *)local_480,lVar1);
    std::__cxx11::string::operator=(local_138 + lVar3,(string *)local_548);
    if (local_548[0] != local_538) {
      operator_delete(local_548[0],local_538[0] + 1);
    }
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    if (local_460[0] != local_450) {
      operator_delete(local_460[0],local_450[0] + 1);
    }
    lVar3 = lVar3 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar3 != 0x100);
  lVar1 = 8;
  do {
    std::__cxx11::string::append((char *)&local_518);
    std::__cxx11::string::_M_append((char *)&local_518,*(ulong *)((long)local_148 + lVar1 + 8));
    std::__cxx11::string::append((char *)&local_518);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x108);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4c0[0]);
  local_258[0] = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"float a","");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_258,local_278,1);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (local_258[0] != &local_248) {
    operator_delete(local_258[0],local_248 + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"float b","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_298,local_2b8,2);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"float c","");
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_2d8,local_2f8,3);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"float d","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_318,local_338,4);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"float e","");
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_358,local_378,5);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"float f","");
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_398,local_3b8,6);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"float g","");
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_3d8,local_3f8,7);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_518);
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"float h","");
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"[2]","");
  (*(local_528->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_548,local_528,local_418,local_438,8);
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_548[0]);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4e0[0]);
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char*>((string *)local_548,local_518,local_518 + local_510);
  std::__cxx11::string::_M_append((char *)local_548,shader_start_abi_cxx11_);
  std::__cxx11::string::append((char *)local_548);
  lVar1 = 8;
  do {
    std::__cxx11::string::_M_append((char *)local_548,*(ulong *)((long)&uStack_240 + lVar1));
    std::__cxx11::string::append((char *)local_548);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0xe8);
  std::__cxx11::string::_M_append((char *)local_548,(ulong)local_158[0]);
  std::__cxx11::string::append((char *)local_548);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_51c) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x6b9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_4e8 = (ulong)local_51c;
  switch(local_4e8) {
  default:
    goto switchD_00b294fe_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)local_548);
    goto switchD_00b294fe_caseD_0;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar2 = &set_tesseation_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)local_548,*puVar2);
switchD_00b294fe_caseD_0:
  std::__cxx11::string::_M_append((char *)local_548,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01ad3140 + *(int *)(&DAT_01ad3140 + local_4e8 * 4)))();
  return;
}

Assistant:

void SizedDeclarationsFunctionParams<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	size_t		dimension_index = 0;
	std::string example_struct1("\nvoid my_function(");
	std::string example_struct2(")\n"
								"{\n"
								"}\n\n");
	std::string base_variable_string;
	std::string variable_basenames[API::MAX_ARRAY_DIMENSIONS] = { "v1", "v2", "v3", "v4", "v5", "v6", "v7", "v8" };
	std::string full_variable_names[API::MAX_ARRAY_DIMENSIONS];

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		full_variable_names[max_dimension_index] =
			this->extend_string(variable_basenames[max_dimension_index], "[2]", max_dimension_index + 1);
	}

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		base_variable_string += "float ";
		base_variable_string += full_variable_names[max_dimension_index];
		base_variable_string += ";\n";
	}

	base_variable_string += example_struct1;
	base_variable_string += this->extend_string("float a", "[2]", 1);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float b", "[2]", 2);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float c", "[2]", 3);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float d", "[2]", 4);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float e", "[2]", 5);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float f", "[2]", 6);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float g", "[2]", 7);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float h", "[2]", 8);
	base_variable_string += example_struct2;

	std::string shader_source = base_variable_string;

	shader_source += shader_start;
	shader_source += "    my_function(";

	for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
	{
		shader_source += variable_basenames[dimension_index];
		shader_source += ", ";
	}

	shader_source += variable_basenames[dimension_index];
	shader_source += ");\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	/* Only the previous case should succeed, so start from index 1 rather than 0.
	 * The other cases should fail, so only compile them, rather than trying to also link them.
	 * We'll swap items 2/3, then 2/4, then 2/5, then 2/6, ...
	 * Then we'll swap items 3/4, then 3/5, ...
	 * Repeat, starting for 4/5-8, 5/6-8, 6/7-8...
	 * Finally, we'll swap items 7/8
	 */
	for (size_t swap_item = 1; swap_item < API::MAX_ARRAY_DIMENSIONS; swap_item++)
	{
		for (size_t max_dimension_index = swap_item + 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS;
			 max_dimension_index++)
		{
			std::string temp = variable_basenames[swap_item];

			shader_source							= base_variable_string;
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			shader_source += shader_start;
			shader_source += "    my_function(";

			for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
			{
				shader_source += variable_basenames[dimension_index];
				shader_source += ", ";
			}

			shader_source += variable_basenames[dimension_index];
			shader_source += ");\n";

			temp									= variable_basenames[swap_item];
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* for (int max_dimension_index = swap_item + 1; ...) */
	}	 /* for (int swap_item = 1; ...) */
}